

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLut.h
# Opt level: O2

void __thiscall
Imf_3_4::RgbaLut::RgbaLut<Imath_3_2::half(*)(Imath_3_2::half)>
          (RgbaLut *this,_func_half_half *f,RgbaChannels chn)

{
  halfFunction<Imath_3_2::half>::halfFunction<Imath_3_2::half(*)(Imath_3_2::half)>
            (&this->_lut,f,(half)0xfbff,(half)0x7bff,(half)0x0,(half)0x7c00,(half)0xfc00,
             (half)0x7fff);
  this->_chn = chn;
  return;
}

Assistant:

RgbaLut::RgbaLut (Function f, RgbaChannels chn)
    : _lut (
          f,
          -HALF_MAX,
          HALF_MAX,
          half (0),
          half::posInf (),
          half::negInf (),
          half::qNan ())
    , _chn (chn)
{
    // empty
}